

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

MockSpec<void_*(unsigned_long)> * __thiscall
testing::internal::FunctionMocker<void_*(unsigned_long)>::With
          (FunctionMocker<void_*(unsigned_long)> *this,Matcher<unsigned_long> *m1)

{
  MockSpec<void_*(unsigned_long)> *pMVar1;
  FunctionMockerBase<void_*(unsigned_long)> *in_RDI;
  Matcher<unsigned_long> *in_stack_ffffffffffffffa8;
  
  FunctionMockerBase<void_*(unsigned_long)>::current_spec(in_RDI);
  std::make_tuple<testing::Matcher<unsigned_long>const&>(in_stack_ffffffffffffffa8);
  MockSpec<void_*(unsigned_long)>::SetMatchers
            ((MockSpec<void_*(unsigned_long)> *)in_RDI,
             (ArgumentMatcherTuple *)in_stack_ffffffffffffffa8);
  std::tuple<testing::Matcher<unsigned_long>_>::~tuple
            ((tuple<testing::Matcher<unsigned_long>_> *)0x155eb1);
  pMVar1 = FunctionMockerBase<void_*(unsigned_long)>::current_spec(in_RDI);
  return pMVar1;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1));
    return this->current_spec();
  }